

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void __thiscall Fossilize::StateRecorder::Impl::record_end(Impl *this)

{
  WorkItem local_38;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  Impl *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->record_lock);
  memset(&local_38,0,0x20);
  local_38.type = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
  push_work_locked(this,&local_38);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void StateRecorder::Impl::record_end()
{
	// Signal end of recording with empty work item
	std::lock_guard<std::mutex> lock(record_lock);
	push_work_locked({ VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO /* dummy value */, 0, nullptr, 0 });
}